

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

SynchEvent * absl::GetSynchEvent(void *addr)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  bool bVar3;
  SynchEvent *local_20;
  SynchEvent *e;
  uint32_t h;
  void *addr_local;
  
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  local_20 = *(SynchEvent **)(synch_event + ((long)addr % 0x407 & 0xffffffffU) * 8);
  while( true ) {
    bVar3 = false;
    if (local_20 != (SynchEvent *)0x0) {
      uVar1 = local_20->masked_addr;
      uVar2 = base_internal::HidePtr<void_const>(addr);
      bVar3 = uVar1 != uVar2;
    }
    if (!bVar3) break;
    local_20 = local_20->next;
  }
  if (local_20 != (SynchEvent *)0x0) {
    local_20->refcount = local_20->refcount + 1;
  }
  base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
  return local_20;
}

Assistant:

static SynchEvent *GetSynchEvent(const void *addr) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e != nullptr) {
    e->refcount++;
  }
  synch_event_mu.Unlock();
  return e;
}